

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

int __thiscall
gl4cts::SparseTextureCommitmentTestCase::init
          (SparseTextureCommitmentTestCase *this,EVP_PKEY_CTX *ctx)

{
  reference pvVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  int local_1c;
  
  pvVar2 = &this->mSupportedTargets;
  local_1c = 0xde1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8c1a;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8513;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x9009;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x806f;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x84f5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  pvVar2 = &this->mSupportedInternalFormats;
  local_1c = 0x8229;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8f94;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x822a;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8f98;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x822b;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8f95;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x822c;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8f99;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8d62;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8058;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8f97;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8059;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x906f;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x805b;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8f9b;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x822d;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x822f;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x881a;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x822e;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8230;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8814;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8c3a;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8c3d;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8231;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8232;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8233;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8234;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8235;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8236;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8237;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8238;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8239;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x823a;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x823b;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x823c;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8d8e;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8d7c;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8d88;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8d76;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  local_1c = 0x8d82;
  pvVar1 = std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2,&local_1c);
  return (int)pvVar1;
}

Assistant:

void SparseTextureCommitmentTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_3D);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);

	mSupportedInternalFormats.push_back(GL_R8);
	mSupportedInternalFormats.push_back(GL_R8_SNORM);
	mSupportedInternalFormats.push_back(GL_R16);
	mSupportedInternalFormats.push_back(GL_R16_SNORM);
	mSupportedInternalFormats.push_back(GL_RG8);
	mSupportedInternalFormats.push_back(GL_RG8_SNORM);
	mSupportedInternalFormats.push_back(GL_RG16);
	mSupportedInternalFormats.push_back(GL_RG16_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB565);
	mSupportedInternalFormats.push_back(GL_RGBA8);
	mSupportedInternalFormats.push_back(GL_RGBA8_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB10_A2);
	mSupportedInternalFormats.push_back(GL_RGB10_A2UI);
	mSupportedInternalFormats.push_back(GL_RGBA16);
	mSupportedInternalFormats.push_back(GL_RGBA16_SNORM);
	mSupportedInternalFormats.push_back(GL_R16F);
	mSupportedInternalFormats.push_back(GL_RG16F);
	mSupportedInternalFormats.push_back(GL_RGBA16F);
	mSupportedInternalFormats.push_back(GL_R32F);
	mSupportedInternalFormats.push_back(GL_RG32F);
	mSupportedInternalFormats.push_back(GL_RGBA32F);
	mSupportedInternalFormats.push_back(GL_R11F_G11F_B10F);
	mSupportedInternalFormats.push_back(GL_RGB9_E5);
	mSupportedInternalFormats.push_back(GL_R8I);
	mSupportedInternalFormats.push_back(GL_R8UI);
	mSupportedInternalFormats.push_back(GL_R16I);
	mSupportedInternalFormats.push_back(GL_R16UI);
	mSupportedInternalFormats.push_back(GL_R32I);
	mSupportedInternalFormats.push_back(GL_R32UI);
	mSupportedInternalFormats.push_back(GL_RG8I);
	mSupportedInternalFormats.push_back(GL_RG8UI);
	mSupportedInternalFormats.push_back(GL_RG16I);
	mSupportedInternalFormats.push_back(GL_RG16UI);
	mSupportedInternalFormats.push_back(GL_RG32I);
	mSupportedInternalFormats.push_back(GL_RG32UI);
	mSupportedInternalFormats.push_back(GL_RGBA8I);
	mSupportedInternalFormats.push_back(GL_RGBA8UI);
	mSupportedInternalFormats.push_back(GL_RGBA16I);
	mSupportedInternalFormats.push_back(GL_RGBA16UI);
	mSupportedInternalFormats.push_back(GL_RGBA32I);
}